

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

void fsqr0(uint64_t *out,uint64_t *f1,uint64_t *tmp)

{
  uint64_t *tmp_local;
  uint64_t *f1_local;
  uint64_t *out_local;
  
  fsqr(out,f1,tmp);
  return;
}

Assistant:

static inline void fsqr0(uint64_t *res, uint64_t *x)
{
  uint64_t tmp[8U] = { 0U };
  bn_sqr4(tmp, x);
  mont_reduction(res, tmp);
}